

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfi.cpp
# Opt level: O1

bool ReadDFI(MemFile *file,shared_ptr<Disk> *disk)

{
  char extraout_AL;
  int iVar1;
  ssize_t sVar2;
  exception *peVar3;
  ushort uVar4;
  size_t in_RCX;
  int iVar5;
  DFI_FILE_HEADER fh;
  shared_ptr<DFIDisk> dfi_disk;
  DFI_TRACK_HEADER th;
  Data track_data;
  CylHead cylhead;
  int local_80;
  allocator_type local_79;
  DFIDisk *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  ushort local_62;
  ushort local_60;
  short local_5e;
  uint local_5c;
  void *local_58 [2];
  long local_48;
  shared_ptr<Disk> *local_40;
  CylHead local_38;
  
  local_80 = 0;
  local_40 = disk;
  MemFile::rewind(file,(FILE *)disk);
  if ((extraout_AL != '\0') &&
     (sVar2 = MemFile::read(file,(int)&local_80,(void *)0x4,in_RCX), (char)sVar2 != '\0')) {
    if (local_80 == 0x52454644) {
      peVar3 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[46]>
                (peVar3,(char (*) [46])"old-style DiscFerret images are not supported");
      __cxa_throw(peVar3,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_80 == 0x32454644) {
      local_78 = (DFIDisk *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<DFIDisk,std::allocator<DFIDisk>>
                (&local_70,&local_78,(allocator<DFIDisk> *)local_58);
      do {
        sVar2 = MemFile::read(file,(int)&local_62,(void *)0xa,in_RCX);
        if ((char)sVar2 == '\0') break;
        if (local_5e != 0x100) {
          peVar3 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[39]>
                    (peVar3,(char (*) [39])"hard-sectored images are not supported");
          __cxa_throw(peVar3,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar4 = local_60 << 8 | local_60 >> 8;
        in_RCX = (size_t)uVar4;
        CylHead::CylHead(&local_38,(uint)(ushort)(local_62 << 8 | local_62 >> 8),(uint)uVar4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
                   (ulong)(local_5c >> 0x18 | (local_5c & 0xff0000) >> 8 | (local_5c & 0xff00) << 8
                          | local_5c << 0x18),&local_79);
        iVar5 = (int)local_58[1] - (int)local_58[0];
        iVar1 = MemFile::remaining(file);
        if (iVar1 < iVar5) {
          peVar3 = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[6]>
                    (peVar3,(char (*) [20])"short file reading ",&local_38,(char (*) [6])0x1b3e5b);
          __cxa_throw(peVar3,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        memcpy(local_58[0],(file->m_it)._M_current,(long)iVar5);
        (file->m_it)._M_current = (file->m_it)._M_current + iVar5;
        DFIDisk::add_track_data(local_78,&local_38,(Data *)local_58);
        if (local_58[0] != (void *)0x0) {
          operator_delete(local_58[0],local_48 - (long)local_58[0]);
        }
      } while ((char)sVar2 != '\0');
      std::__cxx11::string::_M_replace
                ((ulong)&(local_78->super_DemandDisk).super_Disk.strType,0,
                 (char *)(local_78->super_DemandDisk).super_Disk.strType._M_string_length,0x1b0cf1);
      (local_40->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)local_78;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(local_40->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                 &local_70);
      if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ReadDFI(MemFile& file, std::shared_ptr<Disk>& disk)
{
    DFI_FILE_HEADER fh{};

    if (!file.rewind() || !file.read(&fh, sizeof(fh)))
        return false;

    if (!memcmp(fh.signature, "DFER", sizeof(fh.signature)))
        throw util::exception("old-style DiscFerret images are not supported");
    else if (memcmp(fh.signature, "DFE2", sizeof(fh.signature)))
        return false;

    auto dfi_disk = std::make_shared<DFIDisk>();

    for (;;)
    {
        DFI_TRACK_HEADER th;
        if (!file.read(&th, sizeof(th)))
            break;

        if (util::betoh(th.sector) != 1)
            throw util::exception("hard-sectored images are not supported");

        CylHead cylhead(util::betoh(th.cyl), util::betoh(th.head));
        auto data_length = (static_cast<uint32_t>(th.datalen[0]) << 24) | (th.datalen[1] << 16) | (th.datalen[2] << 8) | th.datalen[3];

        Data track_data(data_length);
        if (!file.read(track_data))
            throw util::exception("short file reading ", cylhead, " data");

        dfi_disk->add_track_data(cylhead, std::move(track_data));
    }

    dfi_disk->strType = "DFI";
    disk = dfi_disk;

    return true;
}